

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_ldm_fillHashTable(ldmState_t *ldmState,BYTE *ip,BYTE *iend,ldmParams_t *params)

{
  size_t hash_00;
  ldmEntry_t entry_00;
  ldmParams_t ldmParams;
  size_t sVar1;
  BYTE *pBVar2;
  XXH64_hash_t XVar3;
  ldmParams_t *in_RCX;
  BYTE *in_RDX;
  BYTE *in_RSI;
  long in_RDI;
  ldmEntry_t entry;
  U32 hash;
  U64 xxhash;
  BYTE *split;
  uint n;
  size_t hashed;
  uint numSplits;
  size_t *splits;
  ldmRollingHashState_t hashState;
  BYTE *istart;
  BYTE *base;
  U32 hBits;
  U32 minMatchLength;
  size_t in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar4;
  uint local_54;
  size_t *local_50;
  ldmRollingHashState_t local_48;
  BYTE *local_38;
  undefined8 local_30;
  int local_28;
  U32 local_24;
  ldmParams_t *local_20;
  BYTE *local_18;
  BYTE *local_10;
  
  local_24 = in_RCX->minMatchLength;
  local_28 = in_RCX->hashLog - in_RCX->bucketSizeLog;
  local_30 = *(undefined8 *)(in_RDI + 8);
  local_50 = (size_t *)(in_RDI + 0x40);
  local_38 = in_RSI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ZSTD_ldm_gear_init(&local_48,in_RCX);
  for (; local_10 < local_18; local_10 = local_10 + sVar1) {
    local_54 = 0;
    sVar1 = ZSTD_ldm_gear_feed(&local_48,local_10,(long)local_18 - (long)local_10,local_50,&local_54
                              );
    for (uVar4 = 0; uVar4 < local_54; uVar4 = uVar4 + 1) {
      if (local_38 + local_24 <= local_10 + local_50[uVar4]) {
        pBVar2 = local_10 + (local_50[uVar4] - (ulong)local_24);
        XVar3 = XXH_INLINE_XXH64(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x27a707);
        in_stack_ffffffffffffff48._0_4_ = local_20->enableLdm;
        in_stack_ffffffffffffff48._4_4_ = local_20->hashLog;
        in_stack_ffffffffffffff50 = *(void **)&local_20->bucketSizeLog;
        hash_00._0_4_ = local_20->hashRateLog;
        hash_00._4_4_ = local_20->windowLog;
        entry_00.checksum = (uint)XVar3 & (1 << ((byte)local_28 & 0x1f)) - 1U;
        entry_00.offset = (U32)(XVar3 >> 0x20);
        ldmParams.bucketSizeLog = in_stack_ffffffffffffff98;
        ldmParams._0_8_ = pBVar2;
        ldmParams.minMatchLength = uVar4;
        ldmParams.hashRateLog = (int)sVar1;
        ldmParams.windowLog = (int)(sVar1 >> 0x20);
        ZSTD_ldm_insertEntry
                  ((ldmState_t *)CONCAT44((int)pBVar2 - (int)local_30,in_stack_ffffffffffffff78),
                   hash_00,entry_00,ldmParams);
      }
    }
  }
  return;
}

Assistant:

void ZSTD_ldm_fillHashTable(
            ldmState_t* ldmState, const BYTE* ip,
            const BYTE* iend, ldmParams_t const* params)
{
    U32 const minMatchLength = params->minMatchLength;
    U32 const hBits = params->hashLog - params->bucketSizeLog;
    BYTE const* const base = ldmState->window.base;
    BYTE const* const istart = ip;
    ldmRollingHashState_t hashState;
    size_t* const splits = ldmState->splitIndices;
    unsigned numSplits;

    DEBUGLOG(5, "ZSTD_ldm_fillHashTable");

    ZSTD_ldm_gear_init(&hashState, params);
    while (ip < iend) {
        size_t hashed;
        unsigned n;

        numSplits = 0;
        hashed = ZSTD_ldm_gear_feed(&hashState, ip, iend - ip, splits, &numSplits);

        for (n = 0; n < numSplits; n++) {
            if (ip + splits[n] >= istart + minMatchLength) {
                BYTE const* const split = ip + splits[n] - minMatchLength;
                U64 const xxhash = XXH64(split, minMatchLength, 0);
                U32 const hash = (U32)(xxhash & (((U32)1 << hBits) - 1));
                ldmEntry_t entry;

                entry.offset = (U32)(split - base);
                entry.checksum = (U32)(xxhash >> 32);
                ZSTD_ldm_insertEntry(ldmState, hash, entry, *params);
            }
        }

        ip += hashed;
    }
}